

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::mark_undo_ref(CVmObjDict *this,CVmUndoRecord *undo_rec)

{
  uint uVar1;
  int *piVar2;
  CVmObjPageEntry *pCVar3;
  ushort uVar4;
  uint uVar5;
  
  piVar2 = (int *)(undo_rec->id).ptrval;
  if ((piVar2 != (int *)0x0) && (*piVar2 == 2)) {
    uVar1 = piVar2[1];
    pCVar3 = G_obj_table_X.pages_[uVar1 >> 0xc];
    uVar5 = uVar1 & 0xfff;
    uVar4 = *(ushort *)&pCVar3[uVar5].field_0x14;
    if ((uVar4 & 0x20c) == 0x200) {
      pCVar3[uVar5].next_obj_ = G_obj_table_X.gc_queue_head_;
      uVar4 = *(ushort *)&pCVar3[uVar5].field_0x14;
      G_obj_table_X.gc_queue_head_ = uVar1;
    }
    else if ((uVar4 & 8) != 0) {
      return;
    }
    *(ushort *)&pCVar3[uVar5].field_0x14 = uVar4 & 0xfff3 | 8;
  }
  return;
}

Assistant:

void CVmObjDict::mark_undo_ref(VMG_ CVmUndoRecord *undo_rec)
{
    /* check our private record if we have one */
    if (undo_rec->id.ptrval != 0)
    {
        dict_undo_rec *rec;

        /* get my undo record */
        rec = (dict_undo_rec *)undo_rec->id.ptrval;

        /* take the appropriate action */
        switch(rec->action)
        {
        case DICT_UNDO_COMPARATOR:
            /* the 'obj' entry is the old comparator object */
            G_obj_table->mark_all_refs(rec->obj, VMOBJ_REACHABLE);
            break;

        case DICT_UNDO_ADD:
        case DICT_UNDO_DEL:
            /* 
             *   these actions use only weak references, so there's nothing
             *   to do here 
             */
            break;
        }
    }
}